

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void ipred_dc_uv(pel *src,pel *dst,int i_dst,int w,int h,u16 avail_cu,int bit_depth)

{
  int uv_pixel;
  int shift;
  int h2;
  int w2;
  int j;
  int i;
  int dc_v;
  int dc_u;
  u16 avail_cu_local;
  int h_local;
  int w_local;
  int i_dst_local;
  pel *dst_local;
  pel *src_local;
  s16 *pdst;
  int i_1;
  
  i = 0;
  j = 0;
  if ((avail_cu & 2) == 0) {
    if ((avail_cu & 1) == 0) {
      j = 1 << ((char)bit_depth - 1U & 0x1f);
      i._0_2_ = (short)j;
    }
    else {
      for (h2 = 0; h2 < w << 1; h2 = h2 + 2) {
        i = (uint)src[h2 + 2] + i;
        j = (uint)src[h2 + 3] + j;
      }
      i._0_2_ = (short)(i + (w >> 1) >> (g_tbl_log2[w] & 0x1fU));
      j = j + (w >> 1) >> (g_tbl_log2[w] & 0x1fU);
    }
  }
  else {
    for (w2 = 0; w2 < h << 1; w2 = w2 + 2) {
      i = (uint)src[-2 - w2] + i;
      j = (uint)src[-1 - w2] + j;
    }
    if ((avail_cu & 1) == 0) {
      i._0_2_ = (short)(i + (h >> 1) >> (g_tbl_log2[h] & 0x1fU));
      j = j + (h >> 1) >> (g_tbl_log2[h] & 0x1fU);
    }
    else {
      for (h2 = 0; h2 < w << 1; h2 = h2 + 2) {
        i = (uint)src[h2 + 2] + i;
        j = (uint)src[h2 + 3] + j;
      }
      i._0_2_ = (short)((i + (w + h >> 1)) * (int)(0x1000 / (long)(w + h)) >> 0xc);
      j = (j + (w + h >> 1)) * (int)(0x1000 / (long)(w + h)) >> 0xc;
    }
  }
  dc_u = h;
  _w_local = dst;
  while (dc_u != 0) {
    for (pdst._4_4_ = 0; pdst._4_4_ < w; pdst._4_4_ = pdst._4_4_ + 1) {
      *(short *)(_w_local + (long)pdst._4_4_ * 2) = (short)(j << 8) + (short)i;
    }
    _w_local = _w_local + i_dst;
    dc_u = dc_u + -1;
  }
  return;
}

Assistant:

void ipred_dc_uv(pel *src, pel *dst, int i_dst, int w, int h, u16 avail_cu, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int dc_u = 0, dc_v = 0;
    int i, j;
    int w2 = w << 1;
    int h2 = h << 1;

    if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        for (i = 0; i < h2; i += 2) {
            dc_u += src[-i - 2];
            dc_v += src[-i - 1];
        }
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            for (j = 0; j < w2; j += 2) {
                dc_u += src[j + 2];
                dc_v += src[j + 3];
            }
            dc_u = (dc_u + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
            dc_v = (dc_v + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
        } else {
            dc_u = (dc_u + (h >> 1)) >> g_tbl_log2[h];
            dc_v = (dc_v + (h >> 1)) >> g_tbl_log2[h];
        }
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        for (j = 0; j < w2; j += 2) {
            dc_u += src[j + 2];
            dc_v += src[j + 3];
        }
        dc_u = (dc_u + (w >> 1)) >> g_tbl_log2[w];
        dc_v = (dc_v + (w >> 1)) >> g_tbl_log2[w];
    } else {
        dc_u = dc_v = 1 << (bit_depth - 1);
    }

    int shift = sizeof(pel) * 8;
    int uv_pixel = (dc_v << shift) + dc_u;

    while (h--) {
        com_mset_2pel(dst, uv_pixel, w);
        dst += i_dst;
    }
}